

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O3

Reals Omega_h::inertia::anon_unknown_0::get_distances(Reals *coords,Vector<3> center,Vector<3> axis)

{
  int *piVar1;
  double *pdVar2;
  ulong *puVar3;
  double dVar4;
  Alloc *pAVar5;
  undefined8 extraout_RAX;
  undefined7 uVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  Alloc *pAVar6;
  Alloc *extraout_RAX_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  ulong *in_RSI;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  IntIterator last;
  Reals RVar15;
  type f;
  Vector<3> c;
  Write<double> local_128;
  Write<double> local_118;
  double local_108 [4];
  string local_e8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68 [4];
  double local_48 [3];
  
  puVar3 = (ulong *)*in_RSI;
  if (((ulong)puVar3 & 1) == 0) {
    uVar10 = *puVar3;
  }
  else {
    uVar10 = (ulong)puVar3 >> 3;
  }
  iVar9 = (int)(uVar10 >> 3);
  if (iVar9 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    Write<double>::Write(&local_128,iVar9 / 3,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    local_e8._M_dataplus._M_p = (pointer)local_128.shared_alloc_.alloc;
    if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
        local_128.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8._M_dataplus._M_p = (pointer)((local_128.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_128.shared_alloc_.alloc)->use_count = (local_128.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_e8._M_string_length = (size_type)local_128.shared_alloc_.direct_ptr;
    local_e8.field_2._M_allocated_capacity = *in_RSI;
    if ((local_e8.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_e8.field_2._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8.field_2._M_allocated_capacity =
             ((Alloc *)local_e8.field_2._M_allocated_capacity)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_e8.field_2._M_allocated_capacity)->use_count =
             ((Alloc *)local_e8.field_2._M_allocated_capacity)->use_count + 1;
      }
    }
    local_e8.field_2._8_8_ = in_RSI[1];
    local_c8 = center.super_Few<double,_3>.array_[0];
    dStack_c0 = center.super_Few<double,_3>.array_[1];
    local_b8 = center.super_Few<double,_3>.array_[2];
    dStack_b0 = axis.super_Few<double,_3>.array_[0];
    dStack_a8 = axis.super_Few<double,_3>.array_[1];
    dStack_a0 = axis.super_Few<double,_3>.array_[2];
    _Var14._M_p = local_e8._M_dataplus._M_p;
    if (((ulong)local_e8._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_e8._M_dataplus._M_p != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        _Var14._M_p = (pointer)(*(long *)local_e8._M_dataplus._M_p * 8 + 1);
      }
      else {
        *(int *)(local_e8._M_dataplus._M_p + 0x30) = *(int *)(local_e8._M_dataplus._M_p + 0x30) + 1;
      }
    }
    uVar13 = local_e8.field_2._M_allocated_capacity;
    if ((local_e8.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_e8.field_2._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        uVar13 = (Alloc *)(*(long *)local_e8.field_2._M_allocated_capacity * 8 + 1);
      }
      else {
        *(int *)(local_e8.field_2._M_allocated_capacity + 0x30) =
             *(int *)(local_e8.field_2._M_allocated_capacity + 0x30) + 1;
      }
    }
    local_78 = axis.super_Few<double,_3>.array_[1];
    dStack_70 = axis.super_Few<double,_3>.array_[2];
    local_88 = center.super_Few<double,_3>.array_[2];
    dStack_80 = axis.super_Few<double,_3>.array_[0];
    local_98 = center.super_Few<double,_3>.array_[0];
    dStack_90 = center.super_Few<double,_3>.array_[1];
    if (2 < iVar9) {
      if (((ulong)_Var14._M_p & 7) == 0 && (Alloc *)_Var14._M_p != (Alloc *)0x0) {
        ((Alloc *)_Var14._M_p)->use_count = ((Alloc *)_Var14._M_p)->use_count + -1;
        _Var14._M_p = (pointer)(((Alloc *)_Var14._M_p)->size * 8 + 1);
      }
      if ((uVar13 & 7) == 0 && (Alloc *)uVar13 != (Alloc *)0x0) {
        ((Alloc *)uVar13)->use_count = ((Alloc *)uVar13)->use_count + -1;
        uVar13 = ((Alloc *)uVar13)->size * 8 + 1;
      }
      entering_parallel = '\0';
      lVar11 = 0;
      do {
        local_68[2] = (double)*(undefined8 *)(local_e8.field_2._8_8_ + 0x10 + lVar11 * 0x18);
        pdVar2 = (double *)(local_e8.field_2._8_8_ + lVar11 * 0x18);
        local_68[0] = *pdVar2;
        local_68[1] = pdVar2[1];
        local_108[2] = center.super_Few<double,_3>.array_[2];
        local_108[0] = center.super_Few<double,_3>.array_[0];
        local_108[1] = center.super_Few<double,_3>.array_[1];
        lVar12 = 0;
        do {
          local_48[lVar12] = local_68[lVar12] - local_108[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_108[0] = axis.super_Few<double,_3>.array_[0];
        local_108[1] = axis.super_Few<double,_3>.array_[1];
        local_108[2] = axis.super_Few<double,_3>.array_[2];
        dVar4 = local_48[0] * axis.super_Few<double,_3>.array_[0];
        lVar12 = 1;
        do {
          dVar4 = dVar4 + local_48[lVar12] * local_108[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        *(double *)((long)local_128.shared_alloc_.direct_ptr + lVar11 * 8) = dVar4;
        lVar11 = lVar11 + 1;
      } while (iVar9 / 3 != (int)lVar11);
    }
    if ((uVar13 & 7) == 0 && (Alloc *)uVar13 != (Alloc *)0x0) {
      piVar1 = &((Alloc *)uVar13)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar13);
        operator_delete((void *)uVar13,0x48);
      }
    }
    if (((ulong)_Var14._M_p & 7) == 0 && (Alloc *)_Var14._M_p != (Alloc *)0x0) {
      piVar1 = &((Alloc *)_Var14._M_p)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)_Var14._M_p);
        operator_delete(_Var14._M_p,0x48);
      }
    }
    local_118.shared_alloc_.alloc = local_128.shared_alloc_.alloc;
    local_118.shared_alloc_.direct_ptr = local_128.shared_alloc_.direct_ptr;
    if ((((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
         local_128.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_128.shared_alloc_.alloc)->use_count = (local_128.shared_alloc_.alloc)->use_count + -1;
      local_118.shared_alloc_.alloc = (Alloc *)((local_128.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_128.shared_alloc_.alloc = (Alloc *)0x0;
    local_128.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)coords,&local_118);
    pAVar5 = local_118.shared_alloc_.alloc;
    uVar7 = (undefined7)((ulong)extraout_RAX >> 8);
    pvVar8 = extraout_RDX;
    if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
        local_118.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_118.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_118.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
        pvVar8 = extraout_RDX_00;
        uVar7 = extraout_var;
      }
    }
    uVar13 = local_e8.field_2._M_allocated_capacity;
    if ((local_e8.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_e8.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_e8.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_e8.field_2._M_allocated_capacity);
        operator_delete((void *)uVar13,0x48);
        pvVar8 = extraout_RDX_01;
        uVar7 = extraout_var_00;
      }
    }
    _Var14._M_p = local_e8._M_dataplus._M_p;
    if (((ulong)local_e8._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_e8._M_dataplus._M_p != (Alloc *)0x0) {
      piVar1 = (int *)(local_e8._M_dataplus._M_p + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_e8._M_dataplus._M_p);
        operator_delete(_Var14._M_p,0x48);
        pvVar8 = extraout_RDX_02;
        uVar7 = extraout_var_01;
      }
    }
    pAVar5 = local_128.shared_alloc_.alloc;
    pAVar6 = (Alloc *)CONCAT71(uVar7,local_128.shared_alloc_.alloc == (Alloc *)0x0);
    if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
        local_128.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_128.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_128.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
        pAVar6 = extraout_RAX_00;
        pvVar8 = extraout_RDX_03;
      }
    }
    RVar15.write_.shared_alloc_.direct_ptr = pvVar8;
    RVar15.write_.shared_alloc_.alloc = pAVar6;
    return (Reals)RVar15.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Reals get_distances(Reals coords, Vector<3> center, Vector<3> axis) {
  auto n = divide_no_remainder(coords.size(), 3);
  Write<Real> distances(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    distances[i] = (get_vector<3>(coords, i) - center) * axis;
  };
  parallel_for(n, f, "get_distances");
  return distances;
}